

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O1

void __thiscall cfd::api::json::DecodePsbtInput::DecodePsbtInput(DecodePsbtInput *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_JsonClassBase<cfd::api::json::DecodePsbtInput>)._vptr_JsonClassBase =
       (_func_int **)&PTR__DecodePsbtInput_00741c20;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->non_witness_utxo_hex_)._M_dataplus._M_p = (pointer)&(this->non_witness_utxo_hex_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->non_witness_utxo_hex_,"");
  DecodeRawTransactionResponse::DecodeRawTransactionResponse(&this->non_witness_utxo_);
  DecodePsbtUtxo::DecodePsbtUtxo(&this->witness_utxo_);
  (this->partial_signatures_).super_JsonVector<cfd::api::json::PsbtSignatureData>.
  super_vector<cfd::api::json::PsbtSignatureData,_std::allocator<cfd::api::json::PsbtSignatureData>_>
  .
  super__Vector_base<cfd::api::json::PsbtSignatureData,_std::allocator<cfd::api::json::PsbtSignatureData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->partial_signatures_).super_JsonVector<cfd::api::json::PsbtSignatureData>.
  super_vector<cfd::api::json::PsbtSignatureData,_std::allocator<cfd::api::json::PsbtSignatureData>_>
  .
  super__Vector_base<cfd::api::json::PsbtSignatureData,_std::allocator<cfd::api::json::PsbtSignatureData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->partial_signatures_).super_JsonVector<cfd::api::json::PsbtSignatureData>.
  super_vector<cfd::api::json::PsbtSignatureData,_std::allocator<cfd::api::json::PsbtSignatureData>_>
  .
  super__Vector_base<cfd::api::json::PsbtSignatureData,_std::allocator<cfd::api::json::PsbtSignatureData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->partial_signatures_).super_JsonVector<cfd::api::json::PsbtSignatureData>._vptr_JsonVector =
       (_func_int **)&PTR__JsonVector_00741de8;
  (this->sighash_)._M_dataplus._M_p = (pointer)&(this->sighash_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->sighash_,"");
  PsbtScriptData::PsbtScriptData(&this->redeem_script_);
  PsbtScriptData::PsbtScriptData(&this->witness_script_);
  (this->bip32_derivs_).super_JsonVector<cfd::api::json::PsbtBip32Data>.
  super_vector<cfd::api::json::PsbtBip32Data,_std::allocator<cfd::api::json::PsbtBip32Data>_>.
  super__Vector_base<cfd::api::json::PsbtBip32Data,_std::allocator<cfd::api::json::PsbtBip32Data>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bip32_derivs_).super_JsonVector<cfd::api::json::PsbtBip32Data>.
  super_vector<cfd::api::json::PsbtBip32Data,_std::allocator<cfd::api::json::PsbtBip32Data>_>.
  super__Vector_base<cfd::api::json::PsbtBip32Data,_std::allocator<cfd::api::json::PsbtBip32Data>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bip32_derivs_).super_JsonVector<cfd::api::json::PsbtBip32Data>.
  super_vector<cfd::api::json::PsbtBip32Data,_std::allocator<cfd::api::json::PsbtBip32Data>_>.
  super__Vector_base<cfd::api::json::PsbtBip32Data,_std::allocator<cfd::api::json::PsbtBip32Data>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bip32_derivs_).super_JsonVector<cfd::api::json::PsbtBip32Data>._vptr_JsonVector =
       (_func_int **)&PTR__JsonVector_00741fc8;
  DecodeUnlockingScript::DecodeUnlockingScript(&this->final_scriptsig_);
  (this->final_scriptwitness_).
  super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->final_scriptwitness_).
  super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->final_scriptwitness_).
  super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->final_scriptwitness_).
  super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_JsonVector = (_func_int **)&PTR__JsonVector_00741458;
  (this->unknown_).super_JsonVector<cfd::api::json::PsbtMapData>.
  super_vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>.
  super__Vector_base<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->unknown_).super_JsonVector<cfd::api::json::PsbtMapData>.
  super_vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>.
  super__Vector_base<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->unknown_).super_JsonVector<cfd::api::json::PsbtMapData>.
  super_vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>.
  super__Vector_base<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->unknown_).super_JsonVector<cfd::api::json::PsbtMapData>._vptr_JsonVector =
       (_func_int **)&PTR__JsonVector_00741a28;
  CollectFieldName();
  return;
}

Assistant:

DecodePsbtInput() {
    CollectFieldName();
  }